

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O0

void __thiscall
amrex::FluxRegister::CrseAdd
          (FluxRegister *this,MultiFab *mflx,int dir,int srccomp,int destcomp,int numcomp,Real mult,
          Geometry *geom)

{
  DistributionMapping *pDVar1;
  FabArrayBase *in_RSI;
  MultiFab area;
  int in_stack_000002f0;
  Geometry *in_stack_000002f8;
  int nghost;
  MFInfo *info;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffe20;
  BoxArray *bxs;
  Arena *this_00;
  pointer factory;
  
  FabArrayBase::boxArray(in_RSI);
  pDVar1 = FabArrayBase::DistributionMap(in_RSI);
  nghost = (int)((ulong)pDVar1 >> 0x20);
  factory = (pointer)0x0;
  bxs = (BoxArray *)0x0;
  this_00 = (Arena *)0x0;
  info = (MFInfo *)&stack0xfffffffffffffe28;
  MFInfo::MFInfo((MFInfo *)0x12fe90c);
  FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x12fe919);
  MultiFab::MultiFab((MultiFab *)this_00,bxs,(DistributionMapping *)in_stack_fffffffffffffe20,
                     in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,info,
                     (FabFactory<amrex::FArrayBox> *)factory);
  MFInfo::~MFInfo((MFInfo *)0x12fe94f);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (in_stack_fffffffffffffe20,
             (value_type)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
             (int)((ulong)info >> 0x20),(int)info,nghost);
  CrseAdd((FluxRegister *)
          area.super_FabArray<amrex::FArrayBox>.os_temp._M_t.
          super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
          .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl,
          (MultiFab *)
          area.super_FabArray<amrex::FArrayBox>.pcd._M_t.
          super___uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
          .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl,
          (MultiFab *)
          area.super_FabArray<amrex::FArrayBox>.fbd._M_t.
          super___uniq_ptr_impl<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
          .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl,
          area.super_FabArray<amrex::FArrayBox>.shmem.n_points._4_4_,
          (int)area.super_FabArray<amrex::FArrayBox>.shmem.n_points,
          area.super_FabArray<amrex::FArrayBox>.shmem.n_values._4_4_,in_stack_000002f0,
          (Real)area.super_FabArray<amrex::FArrayBox>.shmem._0_8_,in_stack_000002f8);
  MultiFab::~MultiFab((MultiFab *)0x12fe9c7);
  return;
}

Assistant:

void
FluxRegister::CrseAdd (const MultiFab& mflx,
                       int             dir,
                       int             srccomp,
                       int             destcomp,
                       int             numcomp,
                       Real            mult,
                       const Geometry& geom)
{
    BL_ASSERT(srccomp >= 0 && srccomp+numcomp <= mflx.nComp());
    BL_ASSERT(destcomp >= 0 && destcomp+numcomp <= ncomp);

    MultiFab area(mflx.boxArray(), mflx.DistributionMap(), 1, 0,
                  MFInfo(), mflx.Factory());

    area.setVal(1, 0, 1, 0);

    CrseAdd(mflx,area,dir,srccomp,destcomp,numcomp,mult,geom);
}